

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pandore
          (CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uchar uVar25;
  int iVar26;
  CImgArgumentException *this_00;
  char *pcVar27;
  char *pcVar28;
  CImgIOException *pCVar29;
  ulongT uVar30;
  ulong uVar31;
  ulongT uVar32;
  uchar *puVar33;
  undefined8 in_stack_fffffffffffff670;
  undefined4 uVar34;
  char *local_980;
  char *local_698;
  FILE *local_660;
  unsigned_long _maxoff_35;
  unsigned_long off_35;
  uchar *ptrd_35;
  float *buffer_35;
  size_t siz_29;
  unsigned_long _maxoff_34;
  unsigned_long off_34;
  uchar *ptrd_34;
  uint *buffer_34;
  size_t siz_28;
  unsigned_long _maxoff_33;
  unsigned_long off_33;
  uchar *ptrd_33;
  int *buffer_33;
  size_t siz_27;
  unsigned_long _maxoff_32;
  unsigned_long off_32;
  uchar *ptrd_32;
  uchar *buffer_32;
  size_t siz_26;
  unsigned_long _maxoff_31;
  unsigned_long off_31;
  uchar *ptrd_31;
  float *buffer_31;
  size_t siz_25;
  unsigned_long _maxoff_30;
  unsigned_long off_30;
  uchar *ptrd_30;
  uint *buffer_30;
  size_t siz_24;
  unsigned_long _maxoff_29;
  unsigned_long off_29;
  uchar *ptrd_29;
  int *buffer_29;
  size_t siz_23;
  unsigned_long _maxoff_28;
  unsigned_long off_28;
  uchar *ptrd_28;
  uchar *buffer_28;
  size_t siz_22;
  unsigned_long _maxoff_27;
  unsigned_long off_27;
  uchar *ptrd_27;
  float *buffer_27;
  size_t siz_21;
  unsigned_long _maxoff_26;
  unsigned_long off_26;
  uchar *ptrd_26;
  uint *buffer_26;
  size_t siz_20;
  unsigned_long _maxoff_25;
  unsigned_long off_25;
  uchar *ptrd_25;
  int *buffer_25;
  size_t siz_19;
  unsigned_long _maxoff_24;
  unsigned_long off_24;
  uchar *ptrd_24;
  uchar *buffer_24;
  size_t siz_18;
  unsigned_long _maxoff_23;
  unsigned_long off_23;
  uchar *ptrd_23;
  float *buffer_23;
  size_t siz_17;
  unsigned_long _maxoff_22;
  unsigned_long off_22;
  uchar *ptrd_22;
  int *buffer_22;
  size_t siz_16;
  unsigned_long _maxoff_21;
  unsigned_long off_21;
  uchar *ptrd_21;
  uchar *buffer_21;
  size_t siz_15;
  unsigned_long _maxoff_20;
  unsigned_long off_20;
  uchar *ptrd_20;
  float *buffer_20;
  size_t siz_14;
  unsigned_long _maxoff_19;
  unsigned_long off_19;
  uchar *ptrd_19;
  int *buffer_19;
  size_t siz_13;
  unsigned_long _maxoff_18;
  unsigned_long off_18;
  uchar *ptrd_18;
  uchar *buffer_18;
  size_t siz_12;
  unsigned_long _maxoff_17;
  unsigned_long off_17;
  uchar *ptrd_17;
  uint *buffer_17;
  unsigned_long _maxoff_16;
  unsigned_long off_16;
  uchar *ptrd_16;
  unsigned_short *buffer_16;
  unsigned_long _maxoff_15;
  unsigned_long off_15;
  uchar *ptrd_15;
  uchar *buffer_15;
  size_t siz_11;
  unsigned_long _maxoff_14;
  unsigned_long off_14;
  uchar *ptrd_14;
  uint *buffer_14;
  unsigned_long _maxoff_13;
  unsigned_long off_13;
  uchar *ptrd_13;
  unsigned_short *buffer_13;
  unsigned_long _maxoff_12;
  unsigned_long off_12;
  uchar *ptrd_12;
  uchar *buffer_12;
  size_t siz_10;
  unsigned_long _maxoff_11;
  unsigned_long off_11;
  uchar *ptrd_11;
  uint *buffer_11;
  unsigned_long _maxoff_10;
  unsigned_long off_10;
  uchar *ptrd_10;
  unsigned_short *buffer_10;
  unsigned_long _maxoff_9;
  unsigned_long off_9;
  uchar *ptrd_9;
  uchar *buffer_9;
  uint siz_9;
  unsigned_long _maxoff_8;
  unsigned_long off_8;
  uchar *ptrd_8;
  float *buffer_8;
  size_t siz_8;
  unsigned_long _maxoff_7;
  unsigned_long off_7;
  uchar *ptrd_7;
  int *buffer_7;
  size_t siz_7;
  unsigned_long _maxoff_6;
  unsigned_long off_6;
  uchar *ptrd_6;
  uchar *buffer_6;
  size_t siz_6;
  unsigned_long _maxoff_5;
  unsigned_long off_5;
  uchar *ptrd_5;
  float *buffer_5;
  size_t siz_5;
  unsigned_long _maxoff_4;
  unsigned_long off_4;
  uchar *ptrd_4;
  int *buffer_4;
  size_t siz_4;
  unsigned_long _maxoff_3;
  unsigned_long off_3;
  uchar *ptrd_3;
  uchar *buffer_3;
  size_t siz_3;
  unsigned_long _maxoff_2;
  unsigned_long off_2;
  uchar *ptrd_2;
  float *buffer_2;
  size_t siz_2;
  unsigned_long _maxoff_1;
  unsigned_long off_1;
  uchar *ptrd_1;
  int *buffer_1;
  size_t siz_1;
  unsigned_long _maxoff;
  unsigned_long off;
  uchar *ptrd;
  uchar *buffer;
  size_t siz;
  uchar auStack_a8 [7];
  bool endian;
  int ptbuf [4];
  uint dims [8];
  uint local_6c;
  undefined1 local_68 [4];
  uint imageid;
  CImg<char> header;
  FILE *nfile;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  uVar34 = (undefined4)((ulong)in_stack_fffffffffffff670 >> 0x20);
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar33 = this->_data;
    pcVar27 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar27 = "";
    }
    pcVar28 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar33,pcVar27,pcVar28);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_660 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_660 = cimg::fopen(filename,"rb");
  }
  header._data = (char *)local_660;
  CImg<char>::CImg((CImg<char> *)local_68,0x20,1,1,1);
  cimg::fread<char>((char *)header._16_8_,0xc,(FILE *)header._data);
  pcVar27 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_68);
  iVar26 = cimg::strncasecmp("PANDORE",pcVar27,7);
  if (iVar26 == 0) {
    ptbuf[2] = 0;
    ptbuf[3] = 0;
    _auStack_a8 = 0;
    ptbuf[0] = 0;
    ptbuf[1] = 0;
    cimg::fread<unsigned_int>(&local_6c,1,(FILE *)header._data);
    bVar5 = 0xff < local_6c;
    if (bVar5) {
      cimg::invert_endianness<unsigned_int>(&local_6c);
    }
    cimg::fread<char>((char *)header._16_8_,0x14,(FILE *)header._data);
    switch(local_6c) {
    case 2:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,1);
      uVar30 = size(this);
      ptrd = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd,uVar30);
      }
      off = (unsigned_long)this->_data;
      _maxoff = 0;
      uVar32 = size(this);
      for (; _maxoff < uVar32; _maxoff = _maxoff + 1) {
        *(uchar *)off = *ptrd;
        off = off + 1;
        ptrd = ptrd + 1;
      }
      if (ptrd + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd + -uVar30);
      }
      break;
    case 3:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,1);
      uVar30 = size(this);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar30;
      uVar31 = SUB168(auVar6 * ZEXT816(4),0);
      if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_1 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_1,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_1,uVar30);
      }
      off_1 = (unsigned_long)this->_data;
      _maxoff_1 = 0;
      uVar32 = size(this);
      for (; _maxoff_1 < uVar32; _maxoff_1 = _maxoff_1 + 1) {
        *(char *)off_1 = (char)*(undefined4 *)ptrd_1;
        off_1 = off_1 + 1;
        ptrd_1 = ptrd_1 + 4;
      }
      if (ptrd_1 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_1 + uVar30 * -4);
      }
      break;
    case 4:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,1);
      uVar30 = size(this);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar30;
      uVar31 = SUB168(auVar7 * ZEXT816(4),0);
      if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_2 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_2,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_2,uVar30);
      }
      off_2 = (unsigned_long)this->_data;
      _maxoff_2 = 0;
      uVar32 = size(this);
      for (; _maxoff_2 < uVar32; _maxoff_2 = _maxoff_2 + 1) {
        *(char *)off_2 = (char)(int)*(float *)ptrd_2;
        off_2 = off_2 + 1;
        ptrd_2 = ptrd_2 + 4;
      }
      if (ptrd_2 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_2 + uVar30 * -4);
      }
      break;
    case 5:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,1);
      uVar30 = size(this);
      ptrd_3 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_3,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_3,uVar30);
      }
      off_3 = (unsigned_long)this->_data;
      _maxoff_3 = 0;
      uVar32 = size(this);
      for (; _maxoff_3 < uVar32; _maxoff_3 = _maxoff_3 + 1) {
        *(uchar *)off_3 = *ptrd_3;
        off_3 = off_3 + 1;
        ptrd_3 = ptrd_3 + 1;
      }
      if (ptrd_3 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_3 + -uVar30);
      }
      break;
    case 6:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,1);
      uVar30 = size(this);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar30;
      uVar31 = SUB168(auVar8 * ZEXT816(4),0);
      if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_4 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_4,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_4,uVar30);
      }
      off_4 = (unsigned_long)this->_data;
      _maxoff_4 = 0;
      uVar32 = size(this);
      for (; _maxoff_4 < uVar32; _maxoff_4 = _maxoff_4 + 1) {
        *(char *)off_4 = (char)*(undefined4 *)ptrd_4;
        off_4 = off_4 + 1;
        ptrd_4 = ptrd_4 + 4;
      }
      if (ptrd_4 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_4 + uVar30 * -4);
      }
      break;
    case 7:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,1);
      uVar30 = size(this);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar30;
      uVar31 = SUB168(auVar9 * ZEXT816(4),0);
      if (SUB168(auVar9 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_5 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_5,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_5,uVar30);
      }
      off_5 = (unsigned_long)this->_data;
      _maxoff_5 = 0;
      uVar32 = size(this);
      for (; _maxoff_5 < uVar32; _maxoff_5 = _maxoff_5 + 1) {
        *(char *)off_5 = (char)(int)*(float *)ptrd_5;
        off_5 = off_5 + 1;
        ptrd_5 = ptrd_5 + 4;
      }
      if (ptrd_5 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_5 + uVar30 * -4);
      }
      break;
    case 8:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],1);
      uVar30 = size(this);
      ptrd_6 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_6,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_6,uVar30);
      }
      off_6 = (unsigned_long)this->_data;
      _maxoff_6 = 0;
      uVar32 = size(this);
      for (; _maxoff_6 < uVar32; _maxoff_6 = _maxoff_6 + 1) {
        *(uchar *)off_6 = *ptrd_6;
        off_6 = off_6 + 1;
        ptrd_6 = ptrd_6 + 1;
      }
      if (ptrd_6 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_6 + -uVar30);
      }
      break;
    case 9:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],1);
      uVar30 = size(this);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar30;
      uVar31 = SUB168(auVar10 * ZEXT816(4),0);
      if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_7 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_7,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_7,uVar30);
      }
      off_7 = (unsigned_long)this->_data;
      _maxoff_7 = 0;
      uVar32 = size(this);
      for (; _maxoff_7 < uVar32; _maxoff_7 = _maxoff_7 + 1) {
        *(char *)off_7 = (char)*(undefined4 *)ptrd_7;
        off_7 = off_7 + 1;
        ptrd_7 = ptrd_7 + 4;
      }
      if (ptrd_7 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_7 + uVar30 * -4);
      }
      break;
    case 10:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],1);
      uVar30 = size(this);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar30;
      uVar31 = SUB168(auVar11 * ZEXT816(4),0);
      if (SUB168(auVar11 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_8 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_8,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_8,uVar30);
      }
      off_8 = (unsigned_long)this->_data;
      _maxoff_8 = 0;
      uVar32 = size(this);
      for (; _maxoff_8 < uVar32; _maxoff_8 = _maxoff_8 + 1) {
        *(char *)off_8 = (char)(int)*(float *)ptrd_8;
        off_8 = off_8 + 1;
        ptrd_8 = ptrd_8 + 4;
      }
      if (ptrd_8 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_8 + uVar30 * -4);
      }
      break;
    case 0xb:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,ptbuf[3],1,1,1);
      uVar30 = size(this);
      ptrd_9 = (uchar *)operator_new__(uVar30 & 0xffffffff);
      cimg::fread<unsigned_char>(ptrd_9,uVar30 & 0xffffffff,(FILE *)header._data);
      off_9 = (unsigned_long)this->_data;
      _maxoff_9 = 0;
      uVar32 = size(this);
      for (; _maxoff_9 < uVar32; _maxoff_9 = _maxoff_9 + 1) {
        *(uchar *)off_9 = *ptrd_9;
        off_9 = off_9 + 1;
        ptrd_9 = ptrd_9 + 1;
      }
      if (ptrd_9 + -(uVar30 & 0xffffffff) != (uchar *)0x0) {
        operator_delete__(ptrd_9 + -(uVar30 & 0xffffffff));
      }
      break;
    case 0xc:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,ptbuf[3],1,1);
      uVar30 = size(this);
      ptrd_12 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_12,uVar30,(FILE *)header._data);
      off_12 = (unsigned_long)this->_data;
      _maxoff_12 = 0;
      uVar32 = size(this);
      for (; _maxoff_12 < uVar32; _maxoff_12 = _maxoff_12 + 1) {
        *(uchar *)off_12 = *ptrd_12;
        off_12 = off_12 + 1;
        ptrd_12 = ptrd_12 + 1;
      }
      if (ptrd_12 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_12 + -uVar30);
      }
      break;
    case 0xd:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),5,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),5);
      }
      assign(this,0,0,ptbuf[3],1);
      uVar30 = size(this);
      ptrd_15 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_15,uVar30,(FILE *)header._data);
      off_15 = (unsigned_long)this->_data;
      _maxoff_15 = 0;
      uVar32 = size(this);
      for (; _maxoff_15 < uVar32; _maxoff_15 = _maxoff_15 + 1) {
        *(uchar *)off_15 = *ptrd_15;
        off_15 = off_15 + 1;
        ptrd_15 = ptrd_15 + 1;
      }
      if (ptrd_15 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_15 + -uVar30);
      }
      break;
    default:
      if (file == (FILE *)0x0) {
        cimg::fclose((FILE *)header._data);
      }
      pCVar29 = (CImgIOException *)__cxa_allocate_exception(0x10);
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar33 = this->_data;
      pcVar27 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar27 = "";
      }
      pcVar28 = pixel_type();
      local_980 = filename;
      if (filename == (char *)0x0) {
        local_980 = "(FILE*)";
      }
      CImgIOException::CImgIOException
                (pCVar29,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Unable to load data with ID_type %u in file \'%s\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar33,pcVar27,pcVar28,
                 CONCAT44(uVar34,local_6c),local_980);
      __cxa_throw(pCVar29,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    case 0x10:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,ptbuf[3],1,3);
      uVar30 = size(this);
      ptrd_18 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_18,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_18,uVar30);
      }
      off_18 = (unsigned_long)this->_data;
      _maxoff_18 = 0;
      uVar32 = size(this);
      for (; _maxoff_18 < uVar32; _maxoff_18 = _maxoff_18 + 1) {
        *(uchar *)off_18 = *ptrd_18;
        off_18 = off_18 + 1;
        ptrd_18 = ptrd_18 + 1;
      }
      if (ptrd_18 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_18 + -uVar30);
      }
      break;
    case 0x11:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,ptbuf[3],1,3);
      uVar30 = size(this);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar30;
      uVar31 = SUB168(auVar12 * ZEXT816(4),0);
      if (SUB168(auVar12 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_19 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_19,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_19,uVar30);
      }
      off_19 = (unsigned_long)this->_data;
      _maxoff_19 = 0;
      uVar32 = size(this);
      for (; _maxoff_19 < uVar32; _maxoff_19 = _maxoff_19 + 1) {
        *(char *)off_19 = (char)*(undefined4 *)ptrd_19;
        off_19 = off_19 + 1;
        ptrd_19 = ptrd_19 + 4;
      }
      if (ptrd_19 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_19 + uVar30 * -4);
      }
      break;
    case 0x12:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,ptbuf[3],1,3);
      uVar30 = size(this);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar30;
      uVar31 = SUB168(auVar13 * ZEXT816(4),0);
      if (SUB168(auVar13 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_20 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_20,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_20,uVar30);
      }
      off_20 = (unsigned_long)this->_data;
      _maxoff_20 = 0;
      uVar32 = size(this);
      for (; _maxoff_20 < uVar32; _maxoff_20 = _maxoff_20 + 1) {
        *(char *)off_20 = (char)(int)*(float *)ptrd_20;
        off_20 = off_20 + 1;
        ptrd_20 = ptrd_20 + 4;
      }
      if (ptrd_20 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_20 + uVar30 * -4);
      }
      break;
    case 0x13:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),5,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),5);
      }
      assign(this,0,0,ptbuf[3],3);
      uVar30 = size(this);
      ptrd_21 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_21,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_21,uVar30);
      }
      off_21 = (unsigned_long)this->_data;
      _maxoff_21 = 0;
      uVar32 = size(this);
      for (; _maxoff_21 < uVar32; _maxoff_21 = _maxoff_21 + 1) {
        *(uchar *)off_21 = *ptrd_21;
        off_21 = off_21 + 1;
        ptrd_21 = ptrd_21 + 1;
      }
      if (ptrd_21 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_21 + -uVar30);
      }
      break;
    case 0x14:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),5,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),5);
      }
      assign(this,0,0,ptbuf[3],3);
      uVar30 = size(this);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar30;
      uVar31 = SUB168(auVar14 * ZEXT816(4),0);
      if (SUB168(auVar14 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_22 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_22,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_22,uVar30);
      }
      off_22 = (unsigned_long)this->_data;
      _maxoff_22 = 0;
      uVar32 = size(this);
      for (; _maxoff_22 < uVar32; _maxoff_22 = _maxoff_22 + 1) {
        *(char *)off_22 = (char)*(undefined4 *)ptrd_22;
        off_22 = off_22 + 1;
        ptrd_22 = ptrd_22 + 4;
      }
      if (ptrd_22 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_22 + uVar30 * -4);
      }
      break;
    case 0x15:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),5,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),5);
      }
      assign(this,0,0,ptbuf[3],3);
      uVar30 = size(this);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar30;
      uVar31 = SUB168(auVar15 * ZEXT816(4),0);
      if (SUB168(auVar15 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_23 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_23,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_23,uVar30);
      }
      off_23 = (unsigned_long)this->_data;
      _maxoff_23 = 0;
      uVar32 = size(this);
      for (; _maxoff_23 < uVar32; _maxoff_23 = _maxoff_23 + 1) {
        *(char *)off_23 = (char)(int)*(float *)ptrd_23;
        off_23 = off_23 + 1;
        ptrd_23 = ptrd_23 + 4;
      }
      if (ptrd_23 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_23 + uVar30 * -4);
      }
      break;
    case 0x16:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,ptbuf[2]);
      uVar30 = size(this);
      ptrd_24 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_24,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_24,uVar30);
      }
      off_24 = (unsigned_long)this->_data;
      _maxoff_24 = 0;
      uVar32 = size(this);
      for (; _maxoff_24 < uVar32; _maxoff_24 = _maxoff_24 + 1) {
        *(uchar *)off_24 = *ptrd_24;
        off_24 = off_24 + 1;
        ptrd_24 = ptrd_24 + 1;
      }
      if (ptrd_24 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_24 + -uVar30);
      }
      break;
    case 0x17:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,ptbuf[2]);
      uVar30 = size(this);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar30;
      uVar31 = SUB168(auVar16 * ZEXT816(4),0);
      if (SUB168(auVar16 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_25 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_25,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_25,uVar30);
      }
      off_25 = (unsigned_long)this->_data;
      _maxoff_25 = 0;
      uVar32 = size(this);
      for (; _maxoff_25 < uVar32; _maxoff_25 = _maxoff_25 + 1) {
        *(char *)off_25 = (char)*(undefined4 *)ptrd_25;
        off_25 = off_25 + 1;
        ptrd_25 = ptrd_25 + 4;
      }
      if (ptrd_25 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_25 + uVar30 * -4);
      }
      break;
    case 0x18:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,ptbuf[2]);
      uVar30 = size(this);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar30;
      uVar31 = SUB168(auVar17 * ZEXT816(4),0);
      if (SUB168(auVar17 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_26 = (uchar *)operator_new__(uVar31);
      cimg::fread<unsigned_int>((uint *)ptrd_26,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)ptrd_26,uVar30);
      }
      off_26 = (unsigned_long)this->_data;
      _maxoff_26 = 0;
      uVar32 = size(this);
      for (; _maxoff_26 < uVar32; _maxoff_26 = _maxoff_26 + 1) {
        *(char *)off_26 = (char)*(undefined4 *)ptrd_26;
        off_26 = off_26 + 1;
        ptrd_26 = ptrd_26 + 4;
      }
      if (ptrd_26 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_26 + uVar30 * -4);
      }
      break;
    case 0x19:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),2);
      }
      assign(this,ptbuf[3],1,1,ptbuf[2]);
      uVar30 = size(this);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar30;
      uVar31 = SUB168(auVar18 * ZEXT816(4),0);
      if (SUB168(auVar18 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_27 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_27,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_27,uVar30);
      }
      off_27 = (unsigned_long)this->_data;
      _maxoff_27 = 0;
      uVar32 = size(this);
      for (; _maxoff_27 < uVar32; _maxoff_27 = _maxoff_27 + 1) {
        *(char *)off_27 = (char)(int)*(float *)ptrd_27;
        off_27 = off_27 + 1;
        ptrd_27 = ptrd_27 + 4;
      }
      if (ptrd_27 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_27 + uVar30 * -4);
      }
      break;
    case 0x1a:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,ptbuf[2]);
      uVar30 = size(this);
      ptrd_28 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_28,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_28,uVar30);
      }
      off_28 = (unsigned_long)this->_data;
      _maxoff_28 = 0;
      uVar32 = size(this);
      for (; _maxoff_28 < uVar32; _maxoff_28 = _maxoff_28 + 1) {
        *(uchar *)off_28 = *ptrd_28;
        off_28 = off_28 + 1;
        ptrd_28 = ptrd_28 + 1;
      }
      if (ptrd_28 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_28 + -uVar30);
      }
      break;
    case 0x1b:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,ptbuf[2]);
      uVar30 = size(this);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar30;
      uVar31 = SUB168(auVar19 * ZEXT816(4),0);
      if (SUB168(auVar19 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_29 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_29,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_29,uVar30);
      }
      off_29 = (unsigned_long)this->_data;
      _maxoff_29 = 0;
      uVar32 = size(this);
      for (; _maxoff_29 < uVar32; _maxoff_29 = _maxoff_29 + 1) {
        *(char *)off_29 = (char)*(undefined4 *)ptrd_29;
        off_29 = off_29 + 1;
        ptrd_29 = ptrd_29 + 4;
      }
      if (ptrd_29 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_29 + uVar30 * -4);
      }
      break;
    case 0x1c:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,ptbuf[2]);
      uVar30 = size(this);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar30;
      uVar31 = SUB168(auVar20 * ZEXT816(4),0);
      if (SUB168(auVar20 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_30 = (uchar *)operator_new__(uVar31);
      cimg::fread<unsigned_int>((uint *)ptrd_30,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)ptrd_30,uVar30);
      }
      off_30 = (unsigned_long)this->_data;
      _maxoff_30 = 0;
      uVar32 = size(this);
      for (; _maxoff_30 < uVar32; _maxoff_30 = _maxoff_30 + 1) {
        *(char *)off_30 = (char)*(undefined4 *)ptrd_30;
        off_30 = off_30 + 1;
        ptrd_30 = ptrd_30 + 4;
      }
      if (ptrd_30 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_30 + uVar30 * -4);
      }
      break;
    case 0x1d:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),3);
      }
      assign(this,0,ptbuf[3],1,ptbuf[2]);
      uVar30 = size(this);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar30;
      uVar31 = SUB168(auVar21 * ZEXT816(4),0);
      if (SUB168(auVar21 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_31 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_31,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_31,uVar30);
      }
      off_31 = (unsigned_long)this->_data;
      _maxoff_31 = 0;
      uVar32 = size(this);
      for (; _maxoff_31 < uVar32; _maxoff_31 = _maxoff_31 + 1) {
        *(char *)off_31 = (char)(int)*(float *)ptrd_31;
        off_31 = off_31 + 1;
        ptrd_31 = ptrd_31 + 4;
      }
      if (ptrd_31 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_31 + uVar30 * -4);
      }
      break;
    case 0x1e:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],ptbuf[2]);
      uVar30 = size(this);
      ptrd_32 = (uchar *)operator_new__(uVar30);
      cimg::fread<unsigned_char>(ptrd_32,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_char>(ptrd_32,uVar30);
      }
      off_32 = (unsigned_long)this->_data;
      _maxoff_32 = 0;
      uVar32 = size(this);
      for (; _maxoff_32 < uVar32; _maxoff_32 = _maxoff_32 + 1) {
        *(uchar *)off_32 = *ptrd_32;
        off_32 = off_32 + 1;
        ptrd_32 = ptrd_32 + 1;
      }
      if (ptrd_32 + -uVar30 != (uchar *)0x0) {
        operator_delete__(ptrd_32 + -uVar30);
      }
      break;
    case 0x1f:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],ptbuf[2]);
      uVar30 = size(this);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar30;
      uVar31 = SUB168(auVar22 * ZEXT816(4),0);
      if (SUB168(auVar22 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_33 = (uchar *)operator_new__(uVar31);
      cimg::fread<int>((int *)ptrd_33,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)ptrd_33,uVar30);
      }
      off_33 = (unsigned_long)this->_data;
      _maxoff_33 = 0;
      uVar32 = size(this);
      for (; _maxoff_33 < uVar32; _maxoff_33 = _maxoff_33 + 1) {
        *(char *)off_33 = (char)*(undefined4 *)ptrd_33;
        off_33 = off_33 + 1;
        ptrd_33 = ptrd_33 + 4;
      }
      if (ptrd_33 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_33 + uVar30 * -4);
      }
      break;
    case 0x20:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],ptbuf[2]);
      uVar30 = size(this);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar30;
      uVar31 = SUB168(auVar23 * ZEXT816(4),0);
      if (SUB168(auVar23 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_34 = (uchar *)operator_new__(uVar31);
      cimg::fread<unsigned_int>((uint *)ptrd_34,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)ptrd_34,uVar30);
      }
      off_34 = (unsigned_long)this->_data;
      _maxoff_34 = 0;
      uVar32 = size(this);
      for (; _maxoff_34 < uVar32; _maxoff_34 = _maxoff_34 + 1) {
        *(char *)off_34 = (char)*(undefined4 *)ptrd_34;
        off_34 = off_34 + 1;
        ptrd_34 = ptrd_34 + 4;
      }
      if (ptrd_34 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_34 + uVar30 * -4);
      }
      break;
    case 0x21:
      cimg::fread<unsigned_int>((uint *)(ptbuf + 2),4,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<unsigned_int>((uint *)(ptbuf + 2),4);
      }
      assign(this,0,0,ptbuf[3],ptbuf[2]);
      uVar30 = size(this);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar30;
      uVar31 = SUB168(auVar24 * ZEXT816(4),0);
      if (SUB168(auVar24 * ZEXT816(4),8) != 0) {
        uVar31 = 0xffffffffffffffff;
      }
      ptrd_35 = (uchar *)operator_new__(uVar31);
      cimg::fread<float>((float *)ptrd_35,uVar30,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<float>((float *)ptrd_35,uVar30);
      }
      off_35 = (unsigned_long)this->_data;
      _maxoff_35 = 0;
      uVar32 = size(this);
      for (; _maxoff_35 < uVar32; _maxoff_35 = _maxoff_35 + 1) {
        *(char *)off_35 = (char)(int)*(float *)ptrd_35;
        off_35 = off_35 + 1;
        ptrd_35 = ptrd_35 + 4;
      }
      if (ptrd_35 + uVar30 * -4 != (uchar *)0x0) {
        operator_delete__(ptrd_35 + uVar30 * -4);
      }
      break;
    case 0x22:
      cimg::fread<int>((int *)auStack_a8,1,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)auStack_a8,1);
      }
      assign(this,1,1,1,1);
      uVar25 = auStack_a8[0];
      puVar33 = operator()(this,0);
      *puVar33 = uVar25;
      break;
    case 0x23:
      cimg::fread<int>((int *)auStack_a8,2,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)auStack_a8,2);
      }
      assign(this,2,1,1,1);
      uVar25 = auStack_a8[4];
      puVar33 = operator()(this,0);
      *puVar33 = uVar25;
      uVar25 = auStack_a8[0];
      puVar33 = operator()(this,1);
      *puVar33 = uVar25;
      break;
    case 0x24:
      cimg::fread<int>((int *)auStack_a8,3,(FILE *)header._data);
      if (bVar5) {
        cimg::invert_endianness<int>((int *)auStack_a8,3);
      }
      assign(this,3,1,1,1);
      uVar25 = (uchar)ptbuf[0];
      puVar33 = operator()(this,0);
      *puVar33 = uVar25;
      uVar25 = auStack_a8[4];
      puVar33 = operator()(this,1);
      *puVar33 = uVar25;
      uVar25 = auStack_a8[0];
      puVar33 = operator()(this,2);
      *puVar33 = uVar25;
    }
    if (file == (FILE *)0x0) {
      cimg::fclose((FILE *)header._data);
    }
    CImg<char>::~CImg((CImg<char> *)local_68);
    return this;
  }
  if (file == (FILE *)0x0) {
    cimg::fclose((FILE *)header._data);
  }
  pCVar29 = (CImgIOException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  puVar33 = this->_data;
  pcVar27 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar27 = "";
  }
  pcVar28 = pixel_type();
  local_698 = filename;
  if (filename == (char *)0x0) {
    local_698 = "(FILE*)";
  }
  CImgIOException::CImgIOException
            (pCVar29,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): PANDORE header not found in file \'%s\'."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar33,pcVar27,pcVar28,local_698)
  ;
  __cxa_throw(pCVar29,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImg<T>& _load_pandore(std::FILE *const file, const char *const filename) {
#define __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,ndim,stype) \
        cimg::fread(dims,nbdim,nfile); \
        if (endian) cimg::invert_endianness(dims,nbdim); \
        assign(nwidth,nheight,ndepth,ndim); \
        const size_t siz = size(); \
        stype *buffer = new stype[siz]; \
        cimg::fread(buffer,siz,nfile); \
        if (endian) cimg::invert_endianness(buffer,siz); \
        T *ptrd = _data; \
        cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++); \
        buffer-=siz; \
        delete[] buffer

#define _cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1,stype2,stype3,ltype) { \
        if (sizeof(stype1)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1); } \
        else if (sizeof(stype2)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype2); } \
        else if (sizeof(stype3)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype3); } \
        else throw CImgIOException(_cimg_instance \
                                   "load_pandore(): Unknown pixel datatype in file '%s'.", \
                                   cimg_instance, \
                                   filename?filename:"(FILE*)"); }
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pandore(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<charT> header(32);
      cimg::fread(header._data,12,nfile);
      if (cimg::strncasecmp("PANDORE",header,7)) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): PANDORE header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      unsigned int imageid, dims[8] = { 0 };
      int ptbuf[4] = { 0 };
      cimg::fread(&imageid,1,nfile);
      const bool endian = imageid>255;
      if (endian) cimg::invert_endianness(imageid);
      cimg::fread(header._data,20,nfile);

      switch (imageid) {
      case 2 : _cimg_load_pandore_case(2,dims[1],1,1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 3 : _cimg_load_pandore_case(2,dims[1],1,1,1,long,int,short,4); break;
      case 4 : _cimg_load_pandore_case(2,dims[1],1,1,1,double,float,float,4); break;
      case 5 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 6 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,long,int,short,4); break;
      case 7 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,double,float,float,4); break;
      case 8 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,unsigned char,unsigned char,unsigned char,1); break;
      case 9 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,long,int,short,4); break;
      case 10 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,double,float,float,4); break;
      case 11 : { // Region 1D
        cimg::fread(dims,3,nfile);
        if (endian) cimg::invert_endianness(dims,3);
        assign(dims[1],1,1,1);
        const unsigned siz = size();
        if (dims[2]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[2]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 12 : { // Region 2D
        cimg::fread(dims,4,nfile);
        if (endian) cimg::invert_endianness(dims,4);
        assign(dims[2],dims[1],1,1);
        const size_t siz = size();
        if (dims[3]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[3]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 13 : { // Region 3D
        cimg::fread(dims,5,nfile);
        if (endian) cimg::invert_endianness(dims,5);
        assign(dims[3],dims[2],dims[1],1);
        const size_t siz = size();
        if (dims[4]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[4]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 16 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,unsigned char,unsigned char,unsigned char,1); break;
      case 17 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,long,int,short,4); break;
      case 18 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,double,float,float,4); break;
      case 19 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,unsigned char,unsigned char,unsigned char,1); break;
      case 20 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,long,int,short,4); break;
      case 21 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,double,float,float,4); break;
      case 22 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 23 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],long,int,short,4); break;
      case 24 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 25 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],double,float,float,4); break;
      case 26 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 27 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],long,int,short,4); break;
      case 28 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 29 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],double,float,float,4); break;
      case 30 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned char,unsigned char,unsigned char,1);
        break;
      case 31 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],long,int,short,4); break;
      case 32 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned long,unsigned int,unsigned short,4);
        break;
      case 33 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],double,float,float,4); break;
      case 34 : { // Points 1D
        cimg::fread(ptbuf,1,nfile);
        if (endian) cimg::invert_endianness(ptbuf,1);
        assign(1); (*this)(0) = (T)ptbuf[0];
      } break;
      case 35 : { // Points 2D
        cimg::fread(ptbuf,2,nfile);
        if (endian) cimg::invert_endianness(ptbuf,2);
        assign(2); (*this)(0) = (T)ptbuf[1]; (*this)(1) = (T)ptbuf[0];
      } break;
      case 36 : { // Points 3D
        cimg::fread(ptbuf,3,nfile);
        if (endian) cimg::invert_endianness(ptbuf,3);
        assign(3); (*this)(0) = (T)ptbuf[2]; (*this)(1) = (T)ptbuf[1]; (*this)(2) = (T)ptbuf[0];
      } break;
      default :
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): Unable to load data with ID_type %u in file '%s'.",
                              cimg_instance,
                              imageid,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }